

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O1

void ym3526_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  DEV_SMPL DVar4;
  DEV_SMPL *pDVar5;
  DEV_SMPL *pDVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  
  if (length == 0) {
    uVar9 = 0;
    do {
      lVar7 = (ulong)(uVar9 >> 1) * 0xc0 + 8;
      lVar11 = (ulong)(uVar9 & 1) * 0x58;
      if (*(char *)((long)chip + lVar11 + 0x32 + lVar7) == '\x04') {
        lVar11 = lVar11 + lVar7;
        bVar1 = *(byte *)((long)chip + lVar11 + 0x44);
        if (((*(uint *)((long)chip + 0x6d0) & ~(-1 << (bVar1 & 0x1f))) == 0) &&
           ((int)((uint)""[(ulong)(*(uint *)((long)chip + 0x6d0) >> (bVar1 & 0x1f) & 7) +
                           (ulong)*(byte *)((long)chip + lVar11 + 0x45)] *
                 ~*(uint *)((long)chip + lVar11 + 0x3c)) < 8)) {
          *(undefined4 *)((long)chip + lVar11 + 0x3c) = 0;
          *(undefined1 *)((long)chip + lVar11 + 0x32) = 3;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x12);
  }
  else {
    bVar1 = *(byte *)((long)chip + 0x6e0);
    pDVar5 = *buffer;
    pDVar6 = buffer[1];
    uVar14 = 0;
    do {
      *(undefined4 *)((long)chip + 0x17ac) = 0;
      uVar9 = *(int *)((long)chip + 0x16f0) + *(int *)((long)chip + 0x16f4);
      uVar8 = *(int *)((long)chip + 0x16f0) + 0x2e000000 + *(int *)((long)chip + 0x16f4);
      if (uVar9 < 0xd2000000) {
        uVar8 = uVar9;
      }
      *(uint *)((long)chip + 0x16f0) = uVar8;
      bVar10 = ""[uVar8 >> 0x18] >> 2;
      if (*(char *)((long)chip + 0x16ec) != '\0') {
        bVar10 = ""[uVar8 >> 0x18];
      }
      *(uint *)((long)chip + 0x16e4) = (uint)bVar10;
      uVar9 = *(int *)((long)chip + 0x16f8) + *(int *)((long)chip + 0x16fc);
      *(uint *)((long)chip + 0x16f8) = uVar9;
      *(uint *)((long)chip + 0x16e8) = (uint)*(byte *)((long)chip + 0x16ed) | uVar9 >> 0x18 & 7;
      if (*(char *)((long)chip + 0xc5) == '\0') {
        *(undefined4 *)((long)chip + 0x17a8) = 0;
        iVar12 = *(int *)((long)chip + 0x44);
        iVar13 = *(int *)((long)chip + 0x40);
        uVar9 = *(uint *)((long)chip + 0x58);
        uVar8 = *(uint *)((long)chip + 0x16e4);
        iVar2 = *(int *)((long)chip + 0x30);
        iVar3 = *(int *)((long)chip + 0x34);
        *(int *)((long)chip + 0x30) = iVar3;
        **(int **)((long)chip + 0x28) = **(int **)((long)chip + 0x28) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x34) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x20) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x18) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x20) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x5e)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x34) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0xb0) & *(uint *)((long)chip + 0x16e4)) +
                *(int *)((long)chip + 0x9c) + *(int *)((long)chip + 0x98);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x72) + *(int *)((long)chip + 0x17a8) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0xb6)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x185) == '\0') {
        *(undefined4 *)((long)chip + 0x17a8) = 0;
        iVar12 = *(int *)((long)chip + 0x104);
        iVar13 = *(int *)((long)chip + 0x100);
        uVar9 = *(uint *)((long)chip + 0x118);
        uVar8 = *(uint *)((long)chip + 0x16e4);
        iVar2 = *(int *)((long)chip + 0xf0);
        iVar3 = *(int *)((long)chip + 0xf4);
        *(int *)((long)chip + 0xf0) = iVar3;
        **(int **)((long)chip + 0xe8) = **(int **)((long)chip + 0xe8) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0xf4) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0xe0) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0xd8) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0xe0) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x11e)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0xf4) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x170) & *(uint *)((long)chip + 0x16e4)) +
                *(int *)((long)chip + 0x15c) + *(int *)((long)chip + 0x158);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x132) + *(int *)((long)chip + 0x17a8) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x176)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x245) == '\0') {
        *(undefined4 *)((long)chip + 0x17a8) = 0;
        iVar12 = *(int *)((long)chip + 0x1c4);
        iVar13 = *(int *)((long)chip + 0x1c0);
        uVar9 = *(uint *)((long)chip + 0x1d8);
        uVar8 = *(uint *)((long)chip + 0x16e4);
        iVar2 = *(int *)((long)chip + 0x1b0);
        iVar3 = *(int *)((long)chip + 0x1b4);
        *(int *)((long)chip + 0x1b0) = iVar3;
        **(int **)((long)chip + 0x1a8) = **(int **)((long)chip + 0x1a8) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x1b4) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x1a0) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x198) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x1a0) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x1de)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x1b4) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x230) & *(uint *)((long)chip + 0x16e4)) +
                *(int *)((long)chip + 0x21c) + *(int *)((long)chip + 0x218);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x1f2) + *(int *)((long)chip + 0x17a8) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x236)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x305) == '\0') {
        *(undefined4 *)((long)chip + 0x17a8) = 0;
        iVar12 = *(int *)((long)chip + 0x284);
        iVar13 = *(int *)((long)chip + 0x280);
        uVar9 = *(uint *)((long)chip + 0x298);
        uVar8 = *(uint *)((long)chip + 0x16e4);
        iVar2 = *(int *)((long)chip + 0x270);
        iVar3 = *(int *)((long)chip + 0x274);
        *(int *)((long)chip + 0x270) = iVar3;
        **(int **)((long)chip + 0x268) = **(int **)((long)chip + 0x268) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x274) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x260) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 600) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x260) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x29e)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x274) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x2f0) & *(uint *)((long)chip + 0x16e4)) +
                *(int *)((long)chip + 0x2dc) + *(int *)((long)chip + 0x2d8);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x2b2) + *(int *)((long)chip + 0x17a8) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x2f6)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x3c5) == '\0') {
        *(undefined4 *)((long)chip + 0x17a8) = 0;
        iVar12 = *(int *)((long)chip + 0x344);
        iVar13 = *(int *)((long)chip + 0x340);
        uVar9 = *(uint *)((long)chip + 0x358);
        uVar8 = *(uint *)((long)chip + 0x16e4);
        iVar2 = *(int *)((long)chip + 0x330);
        iVar3 = *(int *)((long)chip + 0x334);
        *(int *)((long)chip + 0x330) = iVar3;
        **(int **)((long)chip + 0x328) = **(int **)((long)chip + 0x328) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x334) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 800) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x318) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 800) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x35e)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x334) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x3b0) & *(uint *)((long)chip + 0x16e4)) +
                *(int *)((long)chip + 0x39c) + *(int *)((long)chip + 0x398);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x372) + *(int *)((long)chip + 0x17a8) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x3b6)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x485) == '\0') {
        *(undefined4 *)((long)chip + 0x17a8) = 0;
        iVar12 = *(int *)((long)chip + 0x404);
        iVar13 = *(int *)((long)chip + 0x400);
        uVar9 = *(uint *)((long)chip + 0x418);
        uVar8 = *(uint *)((long)chip + 0x16e4);
        iVar2 = *(int *)((long)chip + 0x3f0);
        iVar3 = *(int *)((long)chip + 0x3f4);
        *(int *)((long)chip + 0x3f0) = iVar3;
        **(int **)((long)chip + 1000) = **(int **)((long)chip + 1000) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x3f4) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x3e0) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x3d8) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x3e0) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x41e)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x3f4) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x470) & *(uint *)((long)chip + 0x16e4)) +
                *(int *)((long)chip + 0x45c) + *(int *)((long)chip + 0x458);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x432) + *(int *)((long)chip + 0x17a8) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x476)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
        }
      }
      if ((bVar1 & 0x20) == 0) {
        if (*(char *)((long)chip + 0x545) == '\0') {
          *(undefined4 *)((long)chip + 0x17a8) = 0;
          iVar12 = *(int *)((long)chip + 0x4c4);
          iVar13 = *(int *)((long)chip + 0x4c0);
          uVar9 = *(uint *)((long)chip + 0x4d8);
          uVar8 = *(uint *)((long)chip + 0x16e4);
          iVar2 = *(int *)((long)chip + 0x4b0);
          iVar3 = *(int *)((long)chip + 0x4b4);
          *(int *)((long)chip + 0x4b0) = iVar3;
          **(int **)((long)chip + 0x4a8) = **(int **)((long)chip + 0x4a8) + iVar3;
          uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
          *(undefined4 *)((long)chip + 0x4b4) = 0;
          if (uVar9 < 0x180) {
            iVar12 = 0;
            iVar13 = iVar3 + iVar2;
            if (*(byte *)((long)chip + 0x4a0) == 0) {
              iVar13 = iVar12;
            }
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((*(uint *)((long)chip + 0x498) & 0x3ff0000) +
                             (iVar13 << (*(byte *)((long)chip + 0x4a0) & 0x1f)) >> 0x10 & 0x3ff) +
                            (uint)*(ushort *)((long)chip + 0x4de)];
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x4b4) = iVar12;
          }
          uVar9 = (*(uint *)((long)chip + 0x530) & *(uint *)((long)chip + 0x16e4)) +
                  *(int *)((long)chip + 0x51c) + *(int *)((long)chip + 0x518);
          if (uVar9 < 0x180) {
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((uint)*(ushort *)((long)chip + 0x4f2) + *(int *)((long)chip + 0x17a8) &
                            0x3ff) + (uint)*(ushort *)((long)chip + 0x536)];
            iVar12 = 0;
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
          }
        }
        if (*(char *)((long)chip + 0x605) == '\0') {
          *(undefined4 *)((long)chip + 0x17a8) = 0;
          iVar12 = *(int *)((long)chip + 0x584);
          iVar13 = *(int *)((long)chip + 0x580);
          uVar9 = *(uint *)((long)chip + 0x598);
          uVar8 = *(uint *)((long)chip + 0x16e4);
          iVar2 = *(int *)((long)chip + 0x570);
          iVar3 = *(int *)((long)chip + 0x574);
          *(int *)((long)chip + 0x570) = iVar3;
          **(int **)((long)chip + 0x568) = **(int **)((long)chip + 0x568) + iVar3;
          uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
          *(undefined4 *)((long)chip + 0x574) = 0;
          if (uVar9 < 0x180) {
            iVar12 = 0;
            iVar13 = iVar3 + iVar2;
            if (*(byte *)((long)chip + 0x560) == 0) {
              iVar13 = iVar12;
            }
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((*(uint *)((long)chip + 0x558) & 0x3ff0000) +
                             (iVar13 << (*(byte *)((long)chip + 0x560) & 0x1f)) >> 0x10 & 0x3ff) +
                            (uint)*(ushort *)((long)chip + 0x59e)];
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x574) = iVar12;
          }
          uVar9 = (*(uint *)((long)chip + 0x5f0) & *(uint *)((long)chip + 0x16e4)) +
                  *(int *)((long)chip + 0x5dc) + *(int *)((long)chip + 0x5d8);
          if (uVar9 < 0x180) {
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((uint)*(ushort *)((long)chip + 0x5b2) + *(int *)((long)chip + 0x17a8) &
                            0x3ff) + (uint)*(ushort *)((long)chip + 0x5f6)];
            iVar12 = 0;
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
          }
        }
        if (*(char *)((long)chip + 0x6c5) == '\0') {
          *(undefined4 *)((long)chip + 0x17a8) = 0;
          iVar12 = *(int *)((long)chip + 0x644);
          iVar13 = *(int *)((long)chip + 0x640);
          uVar9 = *(uint *)((long)chip + 0x658);
          uVar8 = *(uint *)((long)chip + 0x16e4);
          iVar2 = *(int *)((long)chip + 0x630);
          iVar3 = *(int *)((long)chip + 0x634);
          *(int *)((long)chip + 0x630) = iVar3;
          **(int **)((long)chip + 0x628) = **(int **)((long)chip + 0x628) + iVar3;
          uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
          *(undefined4 *)((long)chip + 0x634) = 0;
          if (uVar9 < 0x180) {
            iVar12 = 0;
            iVar13 = iVar3 + iVar2;
            if (*(byte *)((long)chip + 0x620) == 0) {
              iVar13 = iVar12;
            }
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((*(uint *)((long)chip + 0x618) & 0x3ff0000) +
                             (iVar13 << (*(byte *)((long)chip + 0x620) & 0x1f)) >> 0x10 & 0x3ff) +
                            (uint)*(ushort *)((long)chip + 0x65e)];
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x634) = iVar12;
          }
          uVar9 = (*(uint *)((long)chip + 0x6b0) & *(uint *)((long)chip + 0x16e4)) +
                  *(int *)((long)chip + 0x69c) + *(int *)((long)chip + 0x698);
          if (uVar9 < 0x180) {
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((uint)*(ushort *)((long)chip + 0x672) + *(int *)((long)chip + 0x17a8) &
                            0x3ff) + (uint)*(ushort *)((long)chip + 0x6b6)];
            iVar12 = 0;
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x17ac) = *(int *)((long)chip + 0x17ac) + iVar12;
          }
        }
      }
      else {
        OPL_CALC_RH((FM_OPL *)chip,(OPL_CH *)((long)chip + 8),*(uint *)((long)chip + 0x1700) & 1);
      }
      DVar4 = *(DEV_SMPL *)((long)chip + 0x17ac);
      pDVar5[uVar14] = DVar4;
      pDVar6[uVar14] = DVar4;
      advance((FM_OPL *)chip);
      uVar14 = uVar14 + 1;
    } while (length != uVar14);
  }
  return;
}

Assistant:

void ym3526_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	FM_OPL      *OPL = (FM_OPL *)chip;
	UINT8       rhythm = OPL->rhythm&0x20;
	DEV_SMPL    *bufL;
	DEV_SMPL    *bufR;
	UINT32 i;

	if (! length)
	{
		refresh_eg(OPL);
		return;
	}
	
	bufL = buffer[0];
	bufR = buffer[1];
	for( i=0; i < length ; i++ )
	{
		int lt;

		OPL->output[0] = 0;

		advance_lfo(OPL);

		/* FM part */
		OPL_CALC_CH(OPL, &OPL->P_CH[0]);
		OPL_CALC_CH(OPL, &OPL->P_CH[1]);
		OPL_CALC_CH(OPL, &OPL->P_CH[2]);
		OPL_CALC_CH(OPL, &OPL->P_CH[3]);
		OPL_CALC_CH(OPL, &OPL->P_CH[4]);
		OPL_CALC_CH(OPL, &OPL->P_CH[5]);

		if(!rhythm)
		{
			OPL_CALC_CH(OPL, &OPL->P_CH[6]);
			OPL_CALC_CH(OPL, &OPL->P_CH[7]);
			OPL_CALC_CH(OPL, &OPL->P_CH[8]);
		}
		else        /* Rhythm part */
		{
			OPL_CALC_RH(OPL, &OPL->P_CH[0], (OPL->noise_rng>>0)&1 );
		}

		lt = OPL->output[0];

		/* store to sound buffer */
		bufL[i] = lt;
		bufR[i] = lt;

		advance(OPL);
	}

}